

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::GroupNode::print(GroupNode *this,ostream *cout,int depth)

{
  Node *pNVar1;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"GroupNode @ ",0xc);
  poVar2 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar3 = depth + 1U;
  if (-1 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"closed = ",9);
  bVar5 = SUB81(cout,0);
  poVar2 = std::ostream::_M_insert<bool>(bVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((this->children).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->children).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      iVar4 = depth + 1;
      if (-1 < depth) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(cout,"child",5);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      pNVar1 = (this->children).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].ptr;
      (*(pNVar1->super_RefCount)._vptr_RefCount[4])(pNVar1,cout,(ulong)(depth + 1U));
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->children).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->children).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + bVar5);
  std::ostream::put(bVar5);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::GroupNode::print(std::ostream& cout, int depth)
  {
    cout << "GroupNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    for (size_t i=0; i<children.size(); i++) {
      tab(cout, depth+1); cout << "child" << i << " = "; children[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }